

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_from_filep.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  FILE *pFVar2;
  char *pcVar3;
  int iVar4;
  undefined8 uVar5;
  int *piVar6;
  char *pcVar7;
  long lVar8;
  undefined1 local_60 [8];
  zip_error_t error;
  FILE *fp;
  long lStack_40;
  int err;
  zip_source_t *zs;
  zip_t *za;
  char *name;
  char *file;
  char *archive;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  prg = *argv;
  archive = (char *)argv;
  argv_local._0_4_ = argc;
  if (argc == 3) {
    file = argv[1];
    name = argv[2];
    zs = (zip_source_t *)zip_open(file,1,(long)&fp + 4);
    if (zs == (zip_source_t *)0x0) {
      zip_error_init_with_code(local_60,fp._4_4_);
      pcVar3 = file;
      pFVar2 = _stderr;
      pcVar1 = prg;
      uVar5 = zip_error_strerror(local_60);
      fprintf(pFVar2,"%s: can\'t open zip archive \'%s\': %s\n",pcVar1,pcVar3,uVar5);
      zip_error_fini(local_60);
      argv_local._4_4_ = 1;
    }
    else {
      error.str = (char *)fopen(name,"rb");
      pcVar3 = name;
      pFVar2 = _stderr;
      pcVar1 = prg;
      if ((FILE *)error.str == (FILE *)0x0) {
        piVar6 = __errno_location();
        pcVar7 = strerror(*piVar6);
        fprintf(pFVar2,"%s: can\'t open input file \'%s\': %s\n",pcVar1,pcVar3,pcVar7);
        argv_local._4_4_ = 1;
      }
      else {
        lStack_40 = zip_source_filep(zs,error.str,0,0xffffffffffffffff);
        pcVar3 = name;
        pFVar2 = _stderr;
        pcVar1 = prg;
        if (lStack_40 == 0) {
          uVar5 = zip_strerror(zs);
          fprintf(pFVar2,"%s: error creating file source for \'%s\': %s\n",pcVar1,pcVar3,uVar5);
          argv_local._4_4_ = 1;
        }
        else {
          za = (zip_t *)strrchr(name,0x2f);
          if (za == (zip_t *)0x0) {
            za = (zip_t *)name;
          }
          lVar8 = zip_add(zs,za,lStack_40);
          if (lVar8 == -1) {
            zip_source_free(lStack_40);
            pcVar3 = name;
            pFVar2 = _stderr;
            pcVar1 = prg;
            uVar5 = zip_strerror(zs);
            fprintf(pFVar2,"%s: can\'t add file \'%s\': %s\n",pcVar1,pcVar3,uVar5);
            argv_local._4_4_ = 1;
          }
          else {
            iVar4 = zip_close(zs);
            pcVar3 = file;
            pFVar2 = _stderr;
            pcVar1 = prg;
            if (iVar4 == -1) {
              uVar5 = zip_strerror(zs);
              fprintf(pFVar2,"%s: can\'t close zip archive \'%s\': %s\n",pcVar1,pcVar3,uVar5);
              argv_local._4_4_ = 1;
            }
            else {
              argv_local._4_4_ = 0;
            }
          }
        }
      }
    }
  }
  else {
    fprintf(_stderr,"usage: %s archive file\n",prg);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int
main(int argc, char *argv[]) {
    const char *archive;
    const char *file;
    const char *name;
    zip_t *za;
    zip_source_t *zs;
    int err;
    FILE *fp;

    prg = argv[0];

    if (argc != 3) {
	fprintf(stderr, "usage: %s archive file\n", prg);
	return 1;
    }

    archive = argv[1];
    file = argv[2];

    if ((za = zip_open(archive, ZIP_CREATE, &err)) == NULL) {
	zip_error_t error;
	zip_error_init_with_code(&error, err);
	fprintf(stderr, "%s: can't open zip archive '%s': %s\n", prg, archive, zip_error_strerror(&error));
	zip_error_fini(&error);
	return 1;
    }

    if ((fp = fopen(file, "rb")) == NULL) {
	fprintf(stderr, "%s: can't open input file '%s': %s\n", prg, file, strerror(errno));
	return 1;
    }

    if ((zs = zip_source_filep(za, fp, 0, -1)) == NULL) {
	fprintf(stderr, "%s: error creating file source for '%s': %s\n", prg, file, zip_strerror(za));
	return 1;
    }

    if ((name = strrchr(file, '/')) == NULL)
	name = file;

    if (zip_add(za, name, zs) == -1) {
	zip_source_free(zs);
	fprintf(stderr, "%s: can't add file '%s': %s\n", prg, file, zip_strerror(za));
	return 1;
    }

    if (zip_close(za) == -1) {
	fprintf(stderr, "%s: can't close zip archive '%s': %s\n", prg, archive, zip_strerror(za));
	return 1;
    }

    return 0;
}